

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int TestNumEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                   _func_int_uchar_ptr_int *fun)

{
  int iVar1;
  int iVar2;
  uchar *start;
  _func_int_uchar_ptr_int *fun_local;
  x86Command op_local;
  uchar *stream_local;
  CodeGenGenericContext *ctx_local;
  
  EMIT_OP_NUM(ctx,op,4);
  iVar1 = (*fun)(stream,4);
  EMIT_OP_NUM(ctx,op,0x400);
  iVar2 = (*fun)(stream + iVar1,0x400);
  return ((int)(stream + iVar1) + iVar2) - (int)stream;
}

Assistant:

int TestNumEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, int num))
{
	unsigned char *start = stream;

	EMIT_OP_NUM(ctx, op, 4);
	stream += fun(stream, 4);

	EMIT_OP_NUM(ctx, op, 1024);
	stream += fun(stream, 1024);

	return int(stream - start);
}